

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O0

bool delaunator::in_circle
               (double ax,double ay,double bx,double by,double cx,double cy,double px,double py)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double cp;
  double bp;
  double ap;
  double fy;
  double fx;
  double ey;
  double ex;
  double dy;
  double dx;
  double py_local;
  double px_local;
  double cy_local;
  double cx_local;
  double by_local;
  double bx_local;
  double ay_local;
  double ax_local;
  
  dVar1 = ax - px;
  dVar2 = ay - py;
  dVar3 = bx - px;
  dVar4 = by - py;
  dVar5 = cx - px;
  dVar6 = cy - py;
  dVar7 = dVar3 * dVar3 + dVar4 * dVar4;
  dVar8 = dVar5 * dVar5 + dVar6 * dVar6;
  return (dVar1 * dVar1 + dVar2 * dVar2) * (dVar3 * dVar6 + -(dVar4 * dVar5)) +
         dVar1 * (dVar4 * dVar8 + -(dVar7 * dVar6)) + -(dVar2 * (dVar3 * dVar8 + -(dVar7 * dVar5)))
         < 0.0;
}

Assistant:

inline bool in_circle(
    const double ax,
    const double ay,
    const double bx,
    const double by,
    const double cx,
    const double cy,
    const double px,
    const double py) {
    const double dx = ax - px;
    const double dy = ay - py;
    const double ex = bx - px;
    const double ey = by - py;
    const double fx = cx - px;
    const double fy = cy - py;

    const double ap = dx * dx + dy * dy;
    const double bp = ex * ex + ey * ey;
    const double cp = fx * fx + fy * fy;

    return (dx * (ey * cp - bp * fy) -
            dy * (ex * cp - bp * fx) +
            ap * (ex * fy - ey * fx)) < 0.0;
}